

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O1

QSize __thiscall QAccessibleDisplay::imageSize(QAccessibleDisplay *this)

{
  long lVar1;
  QSize QVar2;
  long in_FS_OFFSET;
  QPixmap local_30 [24];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QAccessibleWidget::widget(&this->super_QAccessibleWidget);
  lVar1 = QMetaObject::cast((QObject *)&QLabel::staticMetaObject);
  if (lVar1 == 0) {
    QVar2.wd.m_i = -1;
    QVar2.ht.m_i = -1;
  }
  else {
    QLabel::pixmap((QLabel *)local_30);
    QVar2 = (QSize)QPixmap::size();
    QPixmap::~QPixmap(local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QSize QAccessibleDisplay::imageSize() const
{
#if QT_CONFIG(label)
    QLabel *label = qobject_cast<QLabel *>(widget());
    if (!label)
#endif
        return QSize();
#if QT_CONFIG(label)
    return label->pixmap().size();
#endif
}